

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O0

vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> * __thiscall
dg::vr::StructureAnalyzer::possibleSources(StructureAnalyzer *this,PHINode *phi,bool bval)

{
  bool bVar1;
  uint uVar2;
  ret_type pCVar3;
  byte in_CL;
  long in_RSI;
  vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *in_RDI;
  VRLocation *end;
  BasicBlock *block;
  ConstantInt *cVal;
  Value *val;
  uint i;
  vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *result;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar4;
  vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *this_00;
  uint local_20;
  
  this_00 = in_RDI;
  std::vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>::vector
            ((vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *)0x1f0e72);
  local_20 = 0;
  do {
    uVar4 = local_20;
    uVar2 = llvm::PHINode::getNumIncomingValues((PHINode *)0x1f0e8c);
    if (uVar2 <= uVar4) {
      return this_00;
    }
    llvm::PHINode::getIncomingValue
              ((PHINode *)CONCAT44(uVar4,in_stack_ffffffffffffff80),
               (uint)((ulong)in_stack_ffffffffffffff78.NodePtr >> 0x20));
    pCVar3 = llvm::dyn_cast<llvm::ConstantInt,llvm::Value_const>
                       ((Value *)CONCAT44(uVar4,in_stack_ffffffffffffff80));
    uVar2 = (uint)((ulong)in_stack_ffffffffffffff78.NodePtr >> 0x20);
    if (pCVar3 == (ret_type)0x0) {
LAB_001f0ef9:
      llvm::PHINode::getIncomingBlock((PHINode *)CONCAT44(uVar4,in_stack_ffffffffffffff80),uVar2);
      in_stack_ffffffffffffff78.NodePtr = *(node_pointer *)(in_RSI + 8);
      llvm::BasicBlock::end((BasicBlock *)in_stack_ffffffffffffff78.NodePtr);
      std::
      prev<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,true>>
                (in_stack_ffffffffffffff78,0x1f0f3a);
      std::
      prev<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,true>>
                (in_stack_ffffffffffffff78,0x1f0f4e);
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
      ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                   *)0x1f0f5d);
      VRCodeGraph::getVRLocation
                ((VRCodeGraph *)CONCAT44(uVar4,in_stack_ffffffffffffff80),
                 (Instruction *)in_stack_ffffffffffffff78.NodePtr);
      VRLocation::getSuccEdge
                ((VRLocation *)CONCAT44(uVar4,in_stack_ffffffffffffff80),
                 (uint)((ulong)in_stack_ffffffffffffff78.NodePtr >> 0x20));
      std::vector<dg::vr::VREdge_const*,std::allocator<dg::vr::VREdge_const*>>::
      emplace_back<dg::vr::VREdge*>(this_00,(VREdge **)in_RDI);
    }
    else {
      bVar1 = llvm::ConstantInt::isOne((ConstantInt *)0x1f0ece);
      uVar2 = (uint)((ulong)in_stack_ffffffffffffff78.NodePtr >> 0x20);
      if ((bVar1) && ((in_CL & 1) != 0)) goto LAB_001f0ef9;
      bVar1 = llvm::ConstantInt::isZero((ConstantInt *)0x1f0ee5);
      uVar2 = (uint)((ulong)in_stack_ffffffffffffff78.NodePtr >> 0x20);
      if ((bVar1) && ((in_CL & 1) == 0)) goto LAB_001f0ef9;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

std::vector<const VREdge *>
StructureAnalyzer::possibleSources(const llvm::PHINode *phi, bool bval) const {
    std::vector<const VREdge *> result;
    for (unsigned i = 0; i < phi->getNumIncomingValues(); ++i) {
        const llvm::Value *val = phi->getIncomingValue(i);
        const auto *cVal = llvm::dyn_cast<llvm::ConstantInt>(val);

        if (!cVal || (cVal->isOne() && bval) || (cVal->isZero() && !bval)) {
            const auto *block = phi->getIncomingBlock(i);
            const VRLocation &end = codeGraph.getVRLocation(
                    &*std::prev(std::prev(block->end())));
            assert(end.succsSize() == 1);
            result.emplace_back(end.getSuccEdge(0));
        }
    }
    return result;
}